

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg.cc
# Opt level: O0

FloatingConvertResult
absl::lts_20250127::str_format_internal::FormatConvertImpl
          (float v,FormatConversionSpecImpl conv,FormatSinkImpl *sink)

{
  bool bVar1;
  FormatSinkImpl *in_RCX;
  FormatConversionSpecImpl conv_00;
  FormatSinkImpl *sink_local;
  float v_local;
  FormatConversionSpecImpl conv_local;
  
  conv_00._0_4_ = conv.precision_;
  conv_00.width_ = 0;
  conv_00.precision_ = (int)sink;
  bVar1 = anon_unknown_53::ConvertFloatArg<float>(conv._0_8_,v,conv_00,in_RCX);
  return (FloatingConvertResult)bVar1;
}

Assistant:

FloatingConvertResult FormatConvertImpl(float v,
                                        const FormatConversionSpecImpl conv,
                                        FormatSinkImpl *sink) {
  return {ConvertFloatArg(v, conv, sink)};
}